

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleFilterCols64_C(uint8_t *dst_ptr,uint8_t *src_ptr,int dst_width,int x32,int dx)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = (ulong)x32;
  lVar1 = 0;
  while( true ) {
    lVar3 = (long)uVar2 >> 0x10;
    if (dst_width + -1 <= (int)lVar1) break;
    dst_ptr[lVar1] =
         (char)(((uint)src_ptr[lVar3 + 1] - (uint)src_ptr[lVar3]) * ((uint)(uVar2 >> 9) & 0x7f) +
                0x40 >> 7) + src_ptr[lVar3];
    lVar4 = uVar2 + (long)dx;
    lVar3 = lVar4 >> 0x10;
    dst_ptr[lVar1 + 1] =
         (char)(((uint)src_ptr[lVar3 + 1] - (uint)src_ptr[lVar3]) * (dx + (uint)uVar2 >> 9 & 0x7f) +
                0x40 >> 7) + src_ptr[lVar3];
    uVar2 = lVar4 + dx;
    lVar1 = lVar1 + 2;
  }
  if ((dst_width & 1U) != 0) {
    dst_ptr[lVar1] =
         (char)(((uint)src_ptr[lVar3 + 1] - (uint)src_ptr[lVar3]) * ((uint)uVar2 >> 9 & 0x7f) + 0x40
               >> 7) + src_ptr[lVar3];
  }
  return;
}

Assistant:

void ScaleFilterCols64_C(uint8_t* dst_ptr,
                         const uint8_t* src_ptr,
                         int dst_width,
                         int x32,
                         int dx) {
  int64_t x = (int64_t)(x32);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}